

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_get_block_info(Integer g_a,Integer *num_blocks,Integer *block_dims)

{
  global_array_t *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  pgVar1 = GA;
  lVar4 = (long)GA[g_a + 1000].ndim;
  if (GA[g_a + 1000].distr_type - 2U < 2) {
    lVar3 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar3;
    }
    for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      num_blocks[lVar3] = pgVar1[g_a + 1000].num_blocks[lVar3];
      block_dims[lVar3] = pgVar1[g_a + 1000].block_dims[lVar3];
    }
  }
  else {
    if (GA[g_a + 1000].distr_type == 4) {
      pnga_error("Don\'t know how to respond to get_block_infor for irregular tiled array",0);
      return;
    }
    lVar3 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar3;
    }
    for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      lVar2 = pgVar1[g_a + 1000].block_dims[lVar3];
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      else {
        lVar2 = (pgVar1[g_a + 1000].dims[lVar3] / lVar2 + 1) -
                (ulong)(pgVar1[g_a + 1000].dims[lVar3] % lVar2 == 0);
      }
      num_blocks[lVar3] = lVar2;
      block_dims[lVar3] = pgVar1[g_a + 1000].block_dims[lVar3];
    }
  }
  return;
}

Assistant:

void pnga_get_block_info(Integer g_a, Integer *num_blocks, Integer *block_dims)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer i, ndim;
  ndim = GA[ga_handle].ndim; 
  if (GA[ga_handle].distr_type == SCALAPACK ||
      GA[ga_handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      num_blocks[i] = GA[ga_handle].num_blocks[i];
      block_dims[i] = GA[ga_handle].block_dims[i];
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* not sure what to do here */
    pnga_error("Don't know how to respond to get_block_infor for"
        " irregular tiled array",0);
  } else {
    Integer dim, bsize;
    for (i=0; i<ndim; i++) {
      dim = GA[ga_handle].dims[i];
      bsize = GA[ga_handle].block_dims[i];
      if (bsize > 0) {
        if (dim%bsize == 0) {
          num_blocks[i] = dim/bsize;
        } else {
          num_blocks[i] = dim/bsize+1;
        }
      } else {
        num_blocks[i] = 0;
      }
      block_dims[i] = GA[ga_handle].block_dims[i];
    }
  }
  return;
}